

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isValidServerBasedAuthority
               (XMLCh *host,int port,XMLCh *userinfo,MemoryManager *manager)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLCh theChar;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  
  bVar3 = isWellFormedAddress(host,manager);
  bVar4 = false;
  if ((port + 1U < 0x10001) && (bVar4 = false, bVar3)) {
    if (userinfo == (XMLCh *)0x0) {
      bVar4 = true;
    }
    else {
      theChar = *userinfo;
      while (bVar4 = theChar == L'\0', !bVar4) {
        bVar4 = XMLString::isAlphaNum(theChar);
        lVar6 = 2;
        if (((!bVar4) && (iVar5 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar5 == -1)
            ) && (iVar5 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,*userinfo), iVar5 == -1))
        {
          if (*userinfo != L'%') {
            return false;
          }
          lVar6 = 0;
          do {
            psVar1 = (short *)((long)userinfo + lVar6);
            lVar6 = lVar6 + 2;
          } while (*psVar1 != 0);
          if (0xfffffffffffffffc < (lVar6 >> 1) - 4U) {
            return false;
          }
          bVar4 = XMLString::isHex(userinfo[1]);
          if (!bVar4) {
            return false;
          }
          bVar4 = XMLString::isHex(userinfo[2]);
          lVar6 = 6;
          if (!bVar4) {
            return false;
          }
        }
        pXVar2 = (XMLCh *)((long)userinfo + lVar6);
        userinfo = (XMLCh *)((long)userinfo + lVar6);
        theChar = *pXVar2;
      }
    }
  }
  return bVar4;
}

Assistant:

bool XMLUri::isValidServerBasedAuthority(const XMLCh* const host
                                         , const int port
                                         , const XMLCh* const userinfo
                                         , MemoryManager* const manager)
{
    // The order is important, do not change
    if (!isWellFormedAddress(host, manager))
        return false;

    // check port number
    if ((port > 65535) || (port < 0 && port != -1))
        return false;

    // check userinfo
    if (!userinfo)
        return true;

    const XMLCh* tmpStr = userinfo;
    while (*tmpStr)
    {
        if ( isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}